

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceInterfaceVarInEntryPoint
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          Instruction *entry_point,uint32_t scalar_var_id)

{
  initializer_list<unsigned_int> init_list;
  Instruction *this_00;
  bool bVar1;
  IRContext *pIVar2;
  MessageConsumer *this_01;
  char *__args_3;
  spv_position_t local_1b0;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  allocator<char> local_111;
  string local_110 [8];
  string message;
  function<bool_(unsigned_int_*)> local_e0;
  byte local_bd;
  uint32_t local_bc;
  bool success;
  iterator puStack_b8;
  undefined8 local_b0;
  SmallVector<unsigned_int,_2UL> local_a8;
  Operand local_80;
  _Node_iterator_base<unsigned_int,_false> local_50;
  _Node_iterator_base<unsigned_int,_false> local_48;
  uint32_t local_3c;
  DefUseManager *pDStack_38;
  uint32_t interface_var_id;
  DefUseManager *def_use_mgr;
  Instruction *pIStack_28;
  uint32_t scalar_var_id_local;
  Instruction *entry_point_local;
  Instruction *interface_var_local;
  InterfaceVariableScalarReplacement *this_local;
  
  def_use_mgr._4_4_ = scalar_var_id;
  pIStack_28 = entry_point;
  entry_point_local = interface_var;
  interface_var_local = (Instruction *)this;
  pIVar2 = Pass::context(&this->super_Pass);
  pDStack_38 = IRContext::get_def_use_mgr(pIVar2);
  local_3c = Instruction::result_id(entry_point_local);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(&this->interface_vars_removed_from_entry_point_operands_,&local_3c);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(&this->interface_vars_removed_from_entry_point_operands_);
  bVar1 = std::__detail::operator!=(&local_48,&local_50);
  this_00 = pIStack_28;
  if (bVar1) {
    local_bc = def_use_mgr._4_4_;
    puStack_b8 = &local_bc;
    local_b0 = 1;
    init_list._M_len = 1;
    init_list._M_array = puStack_b8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8,init_list);
    Operand::Operand(&local_80,SPV_OPERAND_TYPE_ID,&local_a8);
    Instruction::AddOperand(this_00,&local_80);
    Operand::~Operand(&local_80);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8);
    analysis::DefUseManager::AnalyzeInstUse(pDStack_38,pIStack_28);
    this_local._7_1_ = 1;
  }
  else {
    message.field_2._8_8_ = &local_3c;
    std::function<bool(unsigned_int*)>::
    function<spvtools::opt::InterfaceVariableScalarReplacement::ReplaceInterfaceVarInEntryPoint(spvtools::opt::Instruction*,spvtools::opt::Instruction*,unsigned_int)::__0,void>
              ((function<bool(unsigned_int*)> *)&local_e0,
               (anon_class_16_2_d8e4f658 *)((long)&message.field_2 + 8));
    bVar1 = Instruction::WhileEachInId(this_00,&local_e0);
    std::function<bool_(unsigned_int_*)>::~function(&local_e0);
    local_bd = (bVar1 ^ 0xffU) & 1;
    if (local_bd == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_110,"interface variable is not an operand of the entry point",&local_111);
      std::allocator<char>::~allocator(&local_111);
      Instruction::PrettyPrint_abi_cxx11_(&local_158,entry_point_local,0x40);
      std::operator+(&local_138,"\n  ",&local_158);
      std::__cxx11::string::operator+=(local_110,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      Instruction::PrettyPrint_abi_cxx11_(&local_198,pIStack_28,0x40);
      std::operator+(&local_178,"\n  ",&local_198);
      std::__cxx11::string::operator+=(local_110,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      pIVar2 = Pass::context(&this->super_Pass);
      this_01 = IRContext::consumer(pIVar2);
      memset(&local_1b0,0,0x18);
      __args_3 = (char *)std::__cxx11::string::c_str();
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(this_01,SPV_MSG_ERROR,"",&local_1b0,__args_3);
      this_local._7_1_ = 0;
      std::__cxx11::string::~string(local_110);
    }
    else {
      analysis::DefUseManager::AnalyzeInstUse(pDStack_38,pIStack_28);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(&this->interface_vars_removed_from_entry_point_operands_,&local_3c);
      this_local._7_1_ = 1;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceInterfaceVarInEntryPoint(
    Instruction* interface_var, Instruction* entry_point,
    uint32_t scalar_var_id) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t interface_var_id = interface_var->result_id();
  if (interface_vars_removed_from_entry_point_operands_.find(
          interface_var_id) !=
      interface_vars_removed_from_entry_point_operands_.end()) {
    entry_point->AddOperand({SPV_OPERAND_TYPE_ID, {scalar_var_id}});
    def_use_mgr->AnalyzeInstUse(entry_point);
    return true;
  }

  bool success = !entry_point->WhileEachInId(
      [&interface_var_id, &scalar_var_id](uint32_t* id) {
        if (*id == interface_var_id) {
          *id = scalar_var_id;
          return false;
        }
        return true;
      });
  if (!success) {
    std::string message(
        "interface variable is not an operand of the entry point");
    message += "\n  " + interface_var->PrettyPrint(
                            SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
    message += "\n  " + entry_point->PrettyPrint(
                            SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES);
    context()->consumer()(SPV_MSG_ERROR, "", {0, 0, 0}, message.c_str());
    return false;
  }

  def_use_mgr->AnalyzeInstUse(entry_point);
  interface_vars_removed_from_entry_point_operands_.insert(interface_var_id);
  return true;
}